

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O0

void boost::python::detail::define_class_init_helper<0>::
     apply<boost::python::class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<std::__cxx11::string,std::__cxx11::string,int>,boost::mpl::size<boost::mpl::vector3<std::__cxx11::string,std::__cxx11::string,int>>>
               (undefined8 param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,
               undefined8 param_5)

{
  def_init_aux<boost::python::class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector3<std::__cxx11::string,std::__cxx11::string,int>,boost::mpl::size<boost::mpl::vector3<std::__cxx11::string,std::__cxx11::string,int>>>
            (param_1,param_3,param_2,param_4,param_5);
  return;
}

Assistant:

static void apply(
          ClassT& cl
        , CallPoliciesT const& policies
        , Signature const& args
        , NArgs
        , char const* doc
        , detail::keyword_range const& keywords)
      {
          detail::def_init_aux(cl, args, NArgs(), policies, doc, keywords);
      }